

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
ScanNewImplicitRoots
          (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          Recycler *recycler)

{
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::ScanNewImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::ScanNewImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->heapBlockList,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::ScanNewImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(fullBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBlockList::ForEach(sweepableHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanNewImplicitRoots(recycler);
        });
    }
#endif

    HeapBlockList::ForEach(heapBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
}